

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx2::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined8 uVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  PrimRefMB *pPVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  char *pcVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  size_t sVar23;
  int iVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar53;
  float fVar54;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar55;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  undefined1 auVar70 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar71;
  undefined1 auVar72 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar73;
  undefined1 auVar74 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar75;
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_218;
  unsigned_long local_1e8;
  size_t local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  ulong local_170;
  anon_class_16_2_07cfa4d6 local_168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined1 local_148 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar66 [64];
  undefined1 auVar68 [64];
  
  aVar62.m128[2] = INFINITY;
  aVar62._0_8_ = 0x7f8000007f800000;
  aVar62.m128[3] = INFINITY;
  auVar66 = ZEXT1664((undefined1  [16])aVar62);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar62;
  aVar67.m128[2] = -INFINITY;
  aVar67._0_8_ = 0xff800000ff800000;
  aVar67.m128[3] = -INFINITY;
  auVar68 = ZEXT1664((undefined1  [16])aVar67);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar67;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar62;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar67;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar62;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar67;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar29._8_4_ = 0x3f800000;
  auVar29._0_8_ = &DAT_3f8000003f800000;
  auVar29._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar29);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar1;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar14 = r->_begin;
  local_218 = __return_storage_ptr__->num_time_segments;
  uVar20 = __return_storage_ptr__->max_num_time_segments;
  auVar37._0_4_ = (__return_storage_ptr__->max_time_range).lower;
  auVar37._4_4_ = (__return_storage_ptr__->max_time_range).upper;
  auVar37._8_4_ = (__return_storage_ptr__->time_range).lower;
  auVar37._12_4_ = (__return_storage_ptr__->time_range).upper;
  auVar58 = ZEXT1664(auVar37);
  aVar75 = aVar62;
  aVar73 = aVar67;
  aVar71 = aVar62;
  aVar69 = aVar67;
  if (uVar14 < r->_end) {
    local_1e8 = (__return_storage_ptr__->object_range)._end;
    auVar77 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar78 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar76 = ZEXT1664((undefined1  [16])aVar62);
    auVar74 = ZEXT1664((undefined1  [16])aVar67);
    auVar72 = ZEXT1664((undefined1  [16])aVar62);
    auVar70 = ZEXT1664((undefined1  [16])aVar67);
    local_1d0 = k;
    do {
      BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      auVar46._8_8_ = 0;
      auVar46._0_4_ = BVar2.lower;
      auVar46._4_4_ = BVar2.upper;
      fVar28 = BVar2.lower;
      auVar37 = vmovshdup_avx(auVar46);
      fVar53 = auVar37._0_4_ - fVar28;
      uVar15 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                   ).super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.field_0x68 * uVar14);
      uVar13 = (ulong)uVar15;
      uVar22 = (ulong)(uVar15 + 1);
      pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar22 < (pBVar3->super_RawBufferView).num) {
        fVar26 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar37 = ZEXT416((uint)(fVar26 * ((t0t1->lower - fVar28) / fVar53) * 1.0000002));
        auVar37 = vroundss_avx(auVar37,auVar37,9);
        auVar37 = vmaxss_avx(auVar77._0_16_,auVar37);
        uVar15 = (uint)auVar37._0_4_;
        auVar37 = ZEXT416((uint)(fVar26 * ((t0t1->upper - fVar28) / fVar53) * 0.99999976));
        auVar37 = vroundss_avx(auVar37,auVar37,10);
        auVar37 = vminss_avx(auVar37,ZEXT416((uint)fVar26));
        uVar18 = (uint)auVar37._0_4_;
        bVar8 = uVar18 < uVar15;
        auVar40._8_4_ = 0x5dccb9a2;
        auVar40._0_8_ = 0x5dccb9a25dccb9a2;
        auVar40._12_4_ = 0x5dccb9a2;
        auVar37 = auVar78._0_16_;
        if (uVar15 <= uVar18) {
          uVar16 = (ulong)(int)uVar15;
          lVar17 = uVar16 * 0x38;
          pcVar19 = pBVar3[uVar16].super_RawBufferView.ptr_ofs;
          sVar23 = pBVar3[uVar16].super_RawBufferView.stride;
          auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar19 + sVar23 * uVar13),auVar37,2);
          auVar46 = vcmpps_avx(*(undefined1 (*) [16])(pcVar19 + sVar23 * uVar13),auVar40,5);
          auVar29 = vorps_avx(auVar29,auVar46);
          if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar29[0xf]) {
            pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.tangents.items;
            do {
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar19 + sVar23 * uVar22),auVar37,2);
              auVar46 = vcmpps_avx(*(undefined1 (*) [16])(pcVar19 + sVar23 * uVar22),auVar40,5);
              auVar29 = vorps_avx(auVar29,auVar46);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') break;
              lVar6 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar17);
              lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).stride + lVar17);
              auVar29 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar13);
              auVar46 = vcmpps_avx(auVar29,auVar37,2);
              auVar29 = vcmpps_avx(auVar29,auVar40,5);
              auVar29 = vorps_avx(auVar46,auVar29);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') break;
              auVar29 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar22);
              auVar46 = vcmpps_avx(auVar29,auVar37,2);
              auVar29 = vcmpps_avx(auVar29,auVar40,5);
              auVar29 = vorps_avx(auVar46,auVar29);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') break;
              uVar16 = uVar16 + 1;
              bVar8 = (ulong)(long)(int)uVar18 < uVar16;
              if ((ulong)(long)(int)uVar18 < uVar16) goto LAB_01a25e8a;
              pcVar19 = *(char **)((long)&pBVar3[1].super_RawBufferView.ptr_ofs + lVar17);
              sVar23 = *(size_t *)((long)&pBVar3[1].super_RawBufferView.stride + lVar17);
              lVar17 = lVar17 + 0x38;
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar19 + sVar23 * uVar13),auVar37,2);
              auVar46 = vcmpps_avx(*(undefined1 (*) [16])(pcVar19 + sVar23 * uVar13),auVar40,5);
              auVar29 = vorps_avx(auVar29,auVar46);
            } while ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar29[0xf]);
          }
          if (!bVar8) goto LAB_01a263d4;
        }
LAB_01a25e8a:
        local_118 = auVar76._0_16_;
        local_108 = auVar74._0_16_;
        local_f8 = auVar72._0_16_;
        local_e8 = auVar70._0_16_;
        local_d8 = auVar58._0_16_;
        local_c8 = auVar68._0_16_;
        local_b8 = auVar66._0_16_;
        local_168.primID = &local_170;
        fVar53 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.time_range.lower;
        fVar25 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.time_range.upper - fVar53;
        fVar32 = (t0t1->lower - fVar53) / fVar25;
        fVar25 = (t0t1->upper - fVar53) / fVar25;
        fVar53 = fVar26 * fVar32;
        fVar28 = fVar26 * fVar25;
        auVar46 = vroundss_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53),9);
        auVar40 = vroundss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),10);
        auVar37 = vmaxss_avx(auVar46,auVar77._0_16_);
        auVar29 = vminss_avx(auVar40,ZEXT416((uint)fVar26));
        iVar21 = (int)auVar37._0_4_;
        fVar39 = auVar29._0_4_;
        uVar15 = (int)auVar46._0_4_;
        if ((int)auVar46._0_4_ < 0) {
          uVar15 = 0xffffffff;
        }
        iVar24 = (int)fVar26 + 1;
        if ((int)auVar40._0_4_ < (int)fVar26 + 1) {
          iVar24 = (int)auVar40._0_4_;
        }
        local_170 = uVar14;
        local_168.this = this;
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_138.field_1,&local_168,(long)iVar21);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_158.field_1,&local_168,(long)(int)fVar39);
        fVar53 = fVar53 - auVar37._0_4_;
        if (iVar24 - uVar15 == 1) {
          auVar37 = vmaxss_avx(ZEXT416((uint)fVar53),ZEXT816(0) << 0x40);
          fVar26 = auVar37._0_4_;
          fVar53 = 1.0 - fVar26;
          auVar59._0_4_ = fVar26 * local_158.m128[0];
          auVar59._4_4_ = fVar26 * local_158.m128[1];
          auVar59._8_4_ = fVar26 * local_158.m128[2];
          auVar59._12_4_ = fVar26 * local_158.m128[3];
          auVar33._4_4_ = fVar53;
          auVar33._0_4_ = fVar53;
          auVar33._8_4_ = fVar53;
          auVar33._12_4_ = fVar53;
          auVar61 = vfmadd231ps_fma(auVar59,auVar33,(undefined1  [16])local_138);
          auVar63._0_4_ = fVar26 * local_148._0_4_;
          auVar63._4_4_ = fVar26 * local_148._4_4_;
          auVar63._8_4_ = fVar26 * local_148._8_4_;
          auVar63._12_4_ = fVar26 * local_148._12_4_;
          auVar65 = vfmadd231ps_fma(auVar63,local_128,auVar33);
          auVar37 = vmaxss_avx(ZEXT416((uint)(fVar39 - fVar28)),ZEXT816(0) << 0x40);
          fVar28 = auVar37._0_4_;
          fVar53 = 1.0 - fVar28;
          auVar41._0_4_ = fVar28 * local_138.m128[0];
          auVar41._4_4_ = fVar28 * local_138.m128[1];
          auVar41._8_4_ = fVar28 * local_138.m128[2];
          auVar41._12_4_ = fVar28 * local_138.m128[3];
          auVar34._4_4_ = fVar53;
          auVar34._0_4_ = fVar53;
          auVar34._8_4_ = fVar53;
          auVar34._12_4_ = fVar53;
          auVar43 = vfmadd231ps_fma(auVar41,auVar34,(undefined1  [16])local_158);
          auVar48._0_4_ = fVar28 * local_128._0_4_;
          auVar48._4_4_ = fVar28 * local_128._4_4_;
          auVar48._8_4_ = fVar28 * local_128._8_4_;
          auVar48._12_4_ = fVar28 * local_128._12_4_;
          auVar50 = vfmadd231ps_fma(auVar48,auVar34,local_148);
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_168,(long)(iVar21 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_168,(long)((int)fVar39 + -1));
          auVar37 = vmaxss_avx(ZEXT416((uint)fVar53),ZEXT816(0) << 0x40);
          fVar27 = auVar37._0_4_;
          auVar60._0_4_ = fVar27 * local_58.m128[0];
          auVar60._4_4_ = fVar27 * local_58.m128[1];
          auVar60._8_4_ = fVar27 * local_58.m128[2];
          auVar60._12_4_ = fVar27 * local_58.m128[3];
          fVar53 = 1.0 - fVar27;
          auVar30._4_4_ = fVar53;
          auVar30._0_4_ = fVar53;
          auVar30._8_4_ = fVar53;
          auVar30._12_4_ = fVar53;
          auVar61 = vfmadd231ps_fma(auVar60,auVar30,(undefined1  [16])local_138);
          auVar64._0_4_ = fVar27 * local_48;
          auVar64._4_4_ = fVar27 * fStack_44;
          auVar64._8_4_ = fVar27 * fStack_40;
          auVar64._12_4_ = fVar27 * fStack_3c;
          auVar65 = vfmadd231ps_fma(auVar64,auVar30,local_128);
          auVar37 = vmaxss_avx(ZEXT416((uint)(fVar39 - fVar28)),ZEXT816(0) << 0x40);
          fVar28 = auVar37._0_4_;
          fVar53 = 1.0 - fVar28;
          auVar42._0_4_ = fVar28 * local_78.m128[0];
          auVar42._4_4_ = fVar28 * local_78.m128[1];
          auVar42._8_4_ = fVar28 * local_78.m128[2];
          auVar42._12_4_ = fVar28 * local_78.m128[3];
          auVar35._4_4_ = fVar53;
          auVar35._0_4_ = fVar53;
          auVar35._8_4_ = fVar53;
          auVar35._12_4_ = fVar53;
          auVar43 = vfmadd231ps_fma(auVar42,auVar35,(undefined1  [16])local_158);
          auVar49._0_4_ = fVar28 * local_68;
          auVar49._4_4_ = fVar28 * fStack_64;
          auVar49._8_4_ = fVar28 * fStack_60;
          auVar49._12_4_ = fVar28 * fStack_5c;
          auVar50 = vfmadd231ps_fma(auVar49,auVar35,local_148);
          if ((int)(uVar15 + 1) < iVar24) {
            sVar23 = (size_t)(uVar15 + 1);
            iVar24 = ~uVar15 + iVar24;
            do {
              fVar28 = ((float)(int)sVar23 / fVar26 - fVar32) / (fVar25 - fVar32);
              fVar53 = 1.0 - fVar28;
              auVar38._0_4_ = auVar43._0_4_ * fVar28;
              fVar39 = auVar43._4_4_;
              auVar38._4_4_ = fVar39 * fVar28;
              fVar27 = auVar43._8_4_;
              auVar38._8_4_ = fVar27 * fVar28;
              fVar47 = auVar43._12_4_;
              auVar38._12_4_ = fVar47 * fVar28;
              auVar36._4_4_ = fVar53;
              auVar36._0_4_ = fVar53;
              auVar36._8_4_ = fVar53;
              auVar36._12_4_ = fVar53;
              auVar37 = vfmadd231ps_fma(auVar38,auVar36,auVar61);
              auVar31._0_4_ = auVar50._0_4_ * fVar28;
              fVar53 = auVar50._4_4_;
              auVar31._4_4_ = fVar53 * fVar28;
              fVar54 = auVar50._8_4_;
              auVar31._8_4_ = fVar54 * fVar28;
              fVar55 = auVar50._12_4_;
              auVar31._12_4_ = fVar55 * fVar28;
              local_a8 = vfmadd231ps_fma(auVar31,auVar65,auVar36);
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_168,sVar23);
              local_1c8 = auVar65._0_4_;
              fStack_1c4 = auVar65._4_4_;
              fStack_1c0 = auVar65._8_4_;
              fStack_1bc = auVar65._12_4_;
              local_1b8 = auVar61._0_4_;
              fStack_1b4 = auVar61._4_4_;
              fStack_1b0 = auVar61._8_4_;
              fStack_1ac = auVar61._12_4_;
              auVar37 = vsubps_avx((undefined1  [16])local_98,auVar37);
              auVar46 = vsubps_avx(local_88,local_a8);
              auVar29 = vminps_avx(auVar37,ZEXT816(0) << 0x40);
              auVar37 = vmaxps_avx(auVar46,ZEXT816(0) << 0x40);
              auVar61._0_4_ = local_1b8 + auVar29._0_4_;
              auVar61._4_4_ = fStack_1b4 + auVar29._4_4_;
              auVar61._8_4_ = fStack_1b0 + auVar29._8_4_;
              auVar61._12_4_ = fStack_1ac + auVar29._12_4_;
              auVar43._0_4_ = auVar43._0_4_ + auVar29._0_4_;
              auVar43._4_4_ = fVar39 + auVar29._4_4_;
              auVar43._8_4_ = fVar27 + auVar29._8_4_;
              auVar43._12_4_ = fVar47 + auVar29._12_4_;
              auVar65._0_4_ = local_1c8 + auVar37._0_4_;
              auVar65._4_4_ = fStack_1c4 + auVar37._4_4_;
              auVar65._8_4_ = fStack_1c0 + auVar37._8_4_;
              auVar65._12_4_ = fStack_1bc + auVar37._12_4_;
              auVar50._0_4_ = auVar50._0_4_ + auVar37._0_4_;
              auVar50._4_4_ = fVar53 + auVar37._4_4_;
              auVar50._8_4_ = fVar54 + auVar37._8_4_;
              auVar50._12_4_ = fVar55 + auVar37._12_4_;
              sVar23 = sVar23 + 1;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
        }
        auVar77 = ZEXT1664(ZEXT816(0) << 0x40);
        aVar9 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar61,ZEXT416(geomID),0x30);
        uVar15 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.numTimeSteps - 1;
        uVar13 = (ulong)uVar15;
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx(auVar65,ZEXT416((uint)uVar14),0x30);
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar43,ZEXT416(uVar15),0x30);
        aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar50,ZEXT416(uVar15),0x30);
        auVar56._8_4_ = 0x3f000000;
        auVar56._0_8_ = 0x3f0000003f000000;
        auVar56._12_4_ = 0x3f000000;
        auVar44._0_4_ = aVar11.x * 0.5;
        auVar44._4_4_ = aVar11.y * 0.5;
        auVar44._8_4_ = aVar11.z * 0.5;
        auVar44._12_4_ = aVar11.field_3.w * 0.5;
        auVar37 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar9,auVar56);
        auVar51._0_4_ = aVar12.x * 0.5;
        auVar51._4_4_ = aVar12.y * 0.5;
        auVar51._8_4_ = aVar12.z * 0.5;
        auVar51._12_4_ = aVar12.field_3.w * 0.5;
        auVar29 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar10,auVar56);
        auVar45._0_4_ = auVar37._0_4_ + auVar29._0_4_;
        auVar45._4_4_ = auVar37._4_4_ + auVar29._4_4_;
        auVar45._8_4_ = auVar37._8_4_ + auVar29._8_4_;
        auVar45._12_4_ = auVar37._12_4_ + auVar29._12_4_;
        auVar37 = vminps_avx(local_b8,(undefined1  [16])aVar9);
        auVar66 = ZEXT1664(auVar37);
        auVar37 = vmaxps_avx(local_c8,(undefined1  [16])aVar10);
        auVar68 = ZEXT1664(auVar37);
        auVar37 = vminps_avx(local_118,(undefined1  [16])aVar11);
        auVar76 = ZEXT1664(auVar37);
        auVar37 = vmaxps_avx(local_108,(undefined1  [16])aVar12);
        auVar74 = ZEXT1664(auVar37);
        auVar37 = vminps_avx(local_f8,auVar45);
        auVar72 = ZEXT1664(auVar37);
        auVar37 = vmaxps_avx(local_e8,auVar45);
        auVar70 = ZEXT1664(auVar37);
        auVar37 = vshufpd_avx(local_d8,local_d8,1);
        BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar52._8_4_ = BVar2.lower;
        auVar52._12_4_ = BVar2.upper;
        auVar52._0_4_ = BVar2.lower;
        auVar52._4_4_ = BVar2.upper;
        auVar37 = vcmpps_avx(auVar37,auVar52,1);
        local_1e8 = local_1e8 + 1;
        local_218 = local_218 + uVar13;
        auVar37 = vshufps_avx(ZEXT416((uint)CONCAT71((int7)(local_218 >> 8),uVar20 < uVar13)),
                              auVar37,0x40);
        auVar46 = vpslld_avx(auVar37,0x1f);
        auVar57._8_8_ = local_d8._8_8_;
        auVar57._0_4_ = BVar2.lower;
        auVar57._4_4_ = BVar2.upper;
        auVar29 = vshufps_avx(auVar57,auVar57,100);
        auVar37 = vblendps_avx(local_d8,auVar52,4);
        auVar37 = vblendvps_avx(auVar37,auVar29,auVar46);
        auVar58 = ZEXT1664(auVar37);
        if (uVar20 <= uVar13) {
          uVar20 = uVar13;
        }
        pPVar4 = prims->items;
        pPVar4[local_1d0].lbounds.bounds0.lower.field_0 = aVar9;
        pPVar4[local_1d0].lbounds.bounds0.upper.field_0 = aVar10;
        pPVar4[local_1d0].lbounds.bounds1.lower.field_0.field_1 = aVar11;
        pPVar4[local_1d0].lbounds.bounds1.upper.field_0.field_1 = aVar12;
        BVar2 = (BBox1f)vmovlpd_avx(auVar52);
        pPVar4[local_1d0].time_range = BVar2;
        auVar78 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
        local_1d0 = local_1d0 + 1;
      }
LAB_01a263d4:
      auVar37 = auVar58._0_16_;
      aVar67 = auVar68._0_16_;
      aVar62 = auVar66._0_16_;
      uVar14 = uVar14 + 1;
    } while (uVar14 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_1e8;
    aVar75 = auVar76._0_16_;
    aVar73 = auVar74._0_16_;
    aVar71 = auVar72._0_16_;
    aVar69 = auVar70._0_16_;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar62;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar67;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar75;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar73;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar71;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar69;
  __return_storage_ptr__->num_time_segments = local_218;
  __return_storage_ptr__->max_num_time_segments = uVar20;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar37._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar37._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar37._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar37._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }